

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void __thiscall
testing::internal::UniversalPrinter<std::variant<int,std::__cxx11::string>>::Visitor::operator()
          (Visitor *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  ostream *poVar1;
  string local_40 [32];
  
  poVar1 = std::operator<<(*(ostream **)this,"\'");
  GetTypeName<std::__cxx11::string>();
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"(index = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")\' with value ");
  std::__cxx11::string::~string(local_40);
  PrintStringTo(u,*(ostream **)this);
  return;
}

Assistant:

void operator()(const U& u) const {
      *os << "'" << GetTypeName<U>() << "(index = " << index
          << ")' with value ";
      UniversalPrint(u, os);
    }